

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,char *s)

{
  uchar uVar1;
  int iVar2;
  CBStringException *pCVar3;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  CBStringException bstr__cppwrapper_exception;
  int l;
  int i;
  char *d;
  char *s_local;
  CBString *this_local;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"CBString::Write protection error",&local_79);
    CBStringException::CBStringException((CBStringException *)local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,(CBStringException *)local_58);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  bstr__cppwrapper_exception.msg.field_2._8_4_ =
       (this->super_tagbstring).mlen - (this->super_tagbstring).slen;
  bstr__cppwrapper_exception.msg.field_2._12_4_ = 0;
  _l = (this->super_tagbstring).data + (this->super_tagbstring).slen;
  d = s;
  while( true ) {
    if ((int)bstr__cppwrapper_exception.msg.field_2._8_4_ <=
        (int)bstr__cppwrapper_exception.msg.field_2._12_4_) {
      (this->super_tagbstring).slen =
           bstr__cppwrapper_exception.msg.field_2._12_4_ + (this->super_tagbstring).slen;
      iVar2 = bcatcstr(&this->super_tagbstring,d);
      if (iVar2 != -1) {
        return this;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,"CBString::Failure in concatenate",&local_d9)
      ;
      CBStringException::CBStringException((CBStringException *)local_b8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar3,(CBStringException *)local_b8);
      __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    uVar1 = *d;
    *_l = uVar1;
    if (uVar1 == '\0') break;
    bstr__cppwrapper_exception.msg.field_2._12_4_ =
         bstr__cppwrapper_exception.msg.field_2._12_4_ + 1;
    _l = _l + 1;
    d = d + 1;
  }
  (this->super_tagbstring).slen =
       bstr__cppwrapper_exception.msg.field_2._12_4_ + (this->super_tagbstring).slen;
  return this;
}

Assistant:

const CBString& CBString::operator += (const char *s) {
	char * d;
	int i, l;

	if (mlen <= 0) bstringThrow ("Write protection error");

	/* Optimistically concatenate directly */
	l = mlen - slen;
	d = (char *) &data[slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			slen += i;
			return *this;
		}
	}
	slen += i;

	if (BSTR_ERR == bcatcstr (this, s)) {
		bstringThrow ("Failure in concatenate");
	}
	return *this;
}